

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::getString(Value *this,char **str,char **cend)

{
  uint local_2c;
  char **ppcStack_28;
  uint length;
  char **cend_local;
  char **str_local;
  Value *this_local;
  
  if ((*(ushort *)&this->field_0x8 & 0xff) == 4) {
    if ((this->value_).int_ == 0) {
      this_local._7_1_ = false;
    }
    else {
      ppcStack_28 = cend;
      cend_local = str;
      str_local = (char **)this;
      decodePrefixedString
                ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0,(this->value_).string_,&local_2c,str);
      *ppcStack_28 = *cend_local + local_2c;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::getString(char const** str, char const** cend) const {
  if (type_ != stringValue) return false;
  if (value_.string_ == 0) return false;
  unsigned length;
  decodePrefixedString(this->allocated_, this->value_.string_, &length, str);
  *cend = *str + length;
  return true;
}